

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall kj::Array<kj::_::KeyMaybeVal>::dispose(Array<kj::_::KeyMaybeVal> *this)

{
  KeyMaybeVal *pKVar1;
  size_t sVar2;
  
  pKVar1 = this->ptr;
  if (pKVar1 != (KeyMaybeVal *)0x0) {
    sVar2 = this->size_;
    this->ptr = (KeyMaybeVal *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pKVar1,0x28,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::_::KeyMaybeVal>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    size_t sizeCopy = size_;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      size_ = 0;
      disposer->dispose(ptrCopy, sizeCopy, sizeCopy);
    }
  }